

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O1

void __thiscall iu_AssertionTest_x_iutest_x_LT_Test::Body(iu_AssertionTest_x_iutest_x_LT_Test *this)

{
  float f1;
  float f0;
  AssertionResult iutest_ar;
  double d1;
  double d0;
  
  return;
}

Assistant:

IUTEST(AssertionTest, LT)
{
    int x0=0, x1=1;
    float f0=0.0f, f1=1.0f;
    double d0=0.0, d1=1.0;
    IUTEST_ASSERT_LT(x0, x1);
    IUTEST_EXPECT_LT(d0, d1);
    IUTEST_INFORM_LT(0.0, 0x1);
    IUTEST_ASSERT_LT(f0, f1);
}